

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe63At3(uint8_t *buf)

{
  return ((ulong)buf[4] |
         (ulong)buf[5] << 8 | (ulong)buf[6] << 0x10 | ((ulong)*(ushort *)(buf + 7) & 0x3ff) << 0x18)
         << 0x1d | (ulong)((uint)buf[2] << 0xd | (uint)buf[3] << 0x15) | (ulong)buf[1] << 5 |
         (ulong)(*buf >> 3);
}

Assistant:

std::uint64_t readFlUIntLe63At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[8];
    res <<= 8;
    res |= buf[7];
    res <<= 8;
    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 5;
    res |= (buf[0] >> 3);
    res &= UINT64_C(0x7fffffffffffffff);
    return res;
}